

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O3

void mazexy(level *lev,coord *cc)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  iVar4 = 100;
  do {
    iVar7 = x_maze_max >> 1;
    uVar1 = mt_random();
    cc->x = SUB161(ZEXT416(uVar1) % SEXT816((long)(iVar7 + -1)),0) * '\x02' + '\x03';
    iVar7 = y_maze_max >> 1;
    uVar1 = mt_random();
    cVar3 = SUB161(ZEXT416(uVar1) % SEXT816((long)(iVar7 + -1)),0) * '\x02' + '\x03';
    cc->y = cVar3;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      iVar4 = x_maze_max >> 1;
      if (1 < iVar4) {
        iVar2 = y_maze_max >> 1;
        iVar7 = 0;
        do {
          if (1 < iVar2) {
            cVar3 = (char)iVar7 * '\x02' + '\x03';
            cc->x = cVar3;
            cVar5 = '\x03';
            iVar6 = iVar2 + -1;
            do {
              if (lev->locations[cVar3][cVar5].typ == '\x19') {
                cc->y = cVar5;
                return;
              }
              cVar5 = cVar5 + '\x02';
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
            cc->y = (char)iVar2 * '\x02' + -1;
          }
          bVar8 = iVar7 != iVar4 + -2;
          iVar7 = iVar7 + 1;
        } while (bVar8);
      }
      panic("mazexy: can\'t find a place!");
    }
  } while (lev->locations[cc->x][cVar3].typ != '\x19');
  return;
}

Assistant:

void mazexy(struct level *lev, coord *cc)
{
	int cpt=0;

	do {
	    cc->x = 3 + 2*rn2((x_maze_max>>1) - 1);
	    cc->y = 3 + 2*rn2((y_maze_max>>1) - 1);
	    cpt++;
	} while (cpt < 100 && lev->locations[cc->x][cc->y].typ != ROOM);
	if (cpt >= 100) {
		int x, y;
		/* last try */
		for (x = 0; x < (x_maze_max>>1) - 1; x++)
		    for (y = 0; y < (y_maze_max>>1) - 1; y++) {
			cc->x = 3 + 2 * x;
			cc->y = 3 + 2 * y;
			if (lev->locations[cc->x][cc->y].typ == ROOM)
			    return;
		    }
		panic("mazexy: can't find a place!");
	}
	return;
}